

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPController.cpp
# Opt level: O1

int __thiscall TCPController::close(TCPController *this,int __fd)

{
  ulong uVar1;
  _Hash_node_base *p_Var2;
  TCPConnection *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  mapped_type *pmVar3;
  ulong uVar4;
  int iVar5;
  __node_base_ptr p_Var6;
  __node_base_ptr p_Var7;
  bool bVar8;
  int local_2c;
  key_type *__k;
  
  local_2c = __fd;
  std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)this);
  uVar1 = (this->connections)._M_h._M_bucket_count;
  uVar4 = (ulong)(long)local_2c % uVar1;
  p_Var6 = (this->connections)._M_h._M_buckets[uVar4];
  p_Var7 = (__node_base_ptr)0x0;
  if ((p_Var6 != (__node_base_ptr)0x0) &&
     (p_Var2 = p_Var6->_M_nxt, p_Var7 = p_Var6, local_2c != *(int *)&p_Var6->_M_nxt[1]._M_nxt)) {
    while (p_Var6 = p_Var2, p_Var2 = p_Var6->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
      p_Var7 = (__node_base_ptr)0x0;
      if (((ulong)(long)*(int *)&p_Var2[1]._M_nxt % uVar1 != uVar4) ||
         (p_Var7 = p_Var6, local_2c == *(int *)&p_Var2[1]._M_nxt)) goto LAB_00108836;
    }
    p_Var7 = (__node_base_ptr)0x0;
  }
LAB_00108836:
  if (p_Var7 == (__node_base_ptr)0x0) {
    bVar8 = true;
  }
  else {
    bVar8 = p_Var7->_M_nxt == (_Hash_node_base *)0x0;
  }
  iVar5 = -1;
  if (!bVar8) {
    __k = &local_2c;
    pmVar3 = std::__detail::
             _Map_base<int,_std::pair<const_int,_std::shared_ptr<TCPConnection>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<TCPConnection>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<int,_std::pair<const_int,_std::shared_ptr<TCPConnection>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<TCPConnection>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this->connections,__k);
    iVar5 = (int)__k;
    this_00 = (pmVar3->super___shared_ptr<TCPConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    this_01 = (pmVar3->super___shared_ptr<TCPConnection,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
              _M_pi;
    if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_01->_M_use_count = this_01->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_01->_M_use_count = this_01->_M_use_count + 1;
      }
    }
    pthread_rwlock_unlock((pthread_rwlock_t *)this);
    TCPConnection::close(this_00,iVar5);
    iVar5 = 0;
    if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
      iVar5 = 0;
    }
  }
  if (bVar8) {
    pthread_rwlock_unlock((pthread_rwlock_t *)this);
  }
  return iVar5;
}

Assistant:

int TCPController::close(int fd) {
    std::shared_lock lock(mutex_);
    if (connections.find(fd) != connections.end()) {
        auto conn = connections[fd];
        lock.unlock();
        conn->close();
        return 0;
    }
    return -1;
}